

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

exr_result_t
fasthuf_decode(exr_const_context_t_conflict pctxt,FastHufDecoder *fhd,uint8_t *src,
              uint64_t numSrcBits,uint16_t *dst,uint64_t numDstElems)

{
  ulong uVar1;
  uint uVar2;
  uint64_t *bufferBack_00;
  long in_RCX;
  uint8_t *in_RDX;
  int *in_RSI;
  long in_RDI;
  long in_R8;
  ulong in_R9;
  uint32_t i;
  uint32_t rleCount;
  uint64_t id;
  int tableIdx;
  int codeLen;
  int symbol;
  uint8_t *currByte;
  uint32_t rleSym;
  int bufferBackNumBits;
  int bufferNumBits;
  uint64_t tMin;
  uint64_t dstIdx;
  uint64_t bufferBack;
  uint64_t buffer;
  uint local_90;
  uint64_t *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  uint in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int numBits;
  undefined4 uVar3;
  int iVar4;
  ulong local_50;
  ulong local_40;
  exr_result_t local_4;
  
  bufferBack_00 = (uint64_t *)(in_RDX + 0x10);
  local_40 = READ64(in_RDX);
  iVar4 = 0x40;
  READ64(in_RDX + 8);
  uVar3 = 0x40;
  local_50 = 0;
  uVar1 = *(ulong *)(in_RSI + 0x114f2);
  numBits = *in_RSI;
  do {
    if (in_R9 <= local_50) {
      if (in_RCX - 0x80U == 0) {
        local_4 = 0;
      }
      else {
        if (in_RDI != 0) {
          (**(code **)(in_RDI + 0x48))
                    (in_RDI,0x17,
                     "Huffman decode error (%d bits of compressed data remains after filling expected output buffer)"
                     ,in_RCX - 0x80U & 0xffffffff);
        }
        local_4 = 0x17;
      }
      return local_4;
    }
    if (local_40 < uVar1) {
      if (iVar4 < 0x40) {
        FastHufDecoder_refill
                  ((uint64_t *)CONCAT44(iVar4,uVar3),numBits,bufferBack_00,
                   (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   (uint8_t **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
        iVar4 = 0x40;
      }
      in_stack_ffffffffffffff88 = 0xd;
      while (local_40 < *(ulong *)(in_RSI + (long)(int)in_stack_ffffffffffffff88 * 2 + 0x10004)) {
        in_stack_ffffffffffffff88 = in_stack_ffffffffffffff88 + 1;
      }
      if ((int)(uint)*(byte *)((long)in_RSI + 9) < (int)in_stack_ffffffffffffff88) {
        if (in_RDI != 0) {
          (**(code **)(in_RDI + 0x48))
                    (in_RDI,0x17,"Huffman decode error (Decoded an invalid symbol)");
        }
        return 0x17;
      }
      in_stack_ffffffffffffff78 =
           (uint64_t *)
           (*(long *)(in_RSI + (long)(int)in_stack_ffffffffffffff88 * 2 + 0x1007c) +
           (local_40 >> (0x40U - (char)in_stack_ffffffffffffff88 & 0x3f)));
      if ((uint64_t *)(ulong)(uint)in_RSI[1] <= in_stack_ffffffffffffff78) {
        if (in_RDI != 0) {
          (**(code **)(in_RDI + 0x48))
                    (in_RDI,0x17,"Huffman decode error (Decoded an invalid symbol)");
        }
        return 0x17;
      }
      in_stack_ffffffffffffff8c = in_RSI[(long)in_stack_ffffffffffffff78 + 3];
    }
    else {
      in_stack_ffffffffffffff84 = (uint)(local_40 >> 0x34);
      in_stack_ffffffffffffff88 =
           (uint)*(byte *)((long)in_RSI + (long)(int)in_stack_ffffffffffffff84 + 0x443c8);
      in_stack_ffffffffffffff8c = in_RSI[(long)(int)in_stack_ffffffffffffff84 + 0x100f2];
    }
    local_40 = local_40 << ((byte)in_stack_ffffffffffffff88 & 0x3f);
    iVar4 = iVar4 - in_stack_ffffffffffffff88;
    if (in_stack_ffffffffffffff8c == numBits) {
      if (iVar4 < 8) {
        FastHufDecoder_refill
                  ((uint64_t *)CONCAT44(iVar4,uVar3),numBits,bufferBack_00,
                   (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   (uint8_t **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
        iVar4 = 0x40;
      }
      uVar2 = (uint)(byte)(local_40 >> 0x38);
      if (local_50 == 0) {
        if (in_RDI != 0) {
          (**(code **)(in_RDI + 0x48))
                    (in_RDI,0x17,"Huffman decode error (RLE code with no previous symbol)");
        }
        return 0x17;
      }
      if (in_R9 < local_50 + uVar2) {
        if (in_RDI != 0) {
          (**(code **)(in_RDI + 0x48))
                    (in_RDI,0x17,
                     "Huffman decode error (Symbol run beyond expected output buffer length)");
        }
        return 0x17;
      }
      if (uVar2 == 0 || 0x7ffffffe < uVar2) {
        if (in_RDI != 0) {
          (**(code **)(in_RDI + 0x48))(in_RDI,0x17,"Huffman decode error (Invalid RLE length)");
        }
        return 0x17;
      }
      for (local_90 = 0; local_90 < uVar2; local_90 = local_90 + 1) {
        *(undefined2 *)(in_R8 + (local_50 + local_90) * 2) =
             *(undefined2 *)(in_R8 + (local_50 - 1) * 2);
      }
      local_50 = uVar2 + local_50;
      local_40 = local_40 << 8;
      iVar4 = iVar4 + -8;
    }
    else {
      *(short *)(in_R8 + local_50 * 2) = (short)in_stack_ffffffffffffff8c;
      local_50 = local_50 + 1;
    }
    if (iVar4 < 0xc) {
      FastHufDecoder_refill
                ((uint64_t *)CONCAT44(iVar4,uVar3),numBits,bufferBack_00,
                 (int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 (uint8_t **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      iVar4 = 0x40;
    }
  } while( true );
}

Assistant:

static exr_result_t
fasthuf_decode (
    exr_const_context_t         pctxt,
    FastHufDecoder* NO_ALIAS    fhd,
    const uint8_t* NO_ALIAS     src,
    uint64_t                    numSrcBits,
    uint16_t* NO_ALIAS          dst,
    uint64_t                    numDstElems)
{
    //
    // Current position (byte/bit) in the src data stream
    // (after the first buffer fill)
    //
    uint64_t buffer, bufferBack, dstIdx, tMin;
    int      bufferNumBits, bufferBackNumBits;
    uint32_t rleSym;

    const uint8_t* NO_ALIAS currByte = src + 2 * sizeof (uint64_t);

    numSrcBits -= 8 * 2 * sizeof (uint64_t);

    //
    // 64-bit buffer holding the current bits in the stream
    //

    buffer        = READ64 (src);
    bufferNumBits = 64;

    //
    // 64-bit buffer holding the next bits in the stream
    //

    bufferBack        = READ64 ((src + sizeof (uint64_t)));
    bufferBackNumBits = 64;
    dstIdx            = 0;

    tMin = fhd->_tableMin;
    rleSym = fhd->_rleSymbol;

    while (dstIdx < numDstElems)
    {
        int symbol, codeLen;

        //
        // Test if we can be table accelerated. If so, directly
        // lookup the output symbol. Otherwise, we need to fall
        // back to searching for the code.
        //
        // If we're doing table lookups, we don't really need
        // a re-filled buffer, so long as we have TABLE_LOOKUP_BITS
        // left. But for a search, we do need a refilled table.
        //

        if (tMin <= buffer)
        {
            int tableIdx = buffer >> INDEX_BIT_SHIFT;
            codeLen = fhd->_tableCodeLen[tableIdx];
            symbol  = fhd->_tableSymbol[tableIdx];
        }
        else
        {
            uint64_t id;

            if (bufferNumBits < 64)
            {
                FastHufDecoder_refill (
                    &buffer,
                    bufferNumBits,
                    &bufferBack,
                    &bufferBackNumBits,
                    &currByte,
                    &numSrcBits);
                bufferNumBits = 64;
            }

            //
            // Brute force search:
            // Find the smallest length where _ljBase[length] <= buffer
            //

            codeLen = TABLE_LOOKUP_BITS + 1;

            /* sentinel zero can never be greater than buffer */
            /* && codeLen <= _maxCodeLength */
            while (fhd->_ljBase[codeLen] > buffer)
                codeLen++;

            if (OUR_UNLIKELY(codeLen > fhd->_maxCodeLength))
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Decoded an invalid symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            id = fhd->_ljOffset[codeLen] + (buffer >> (64 - codeLen));
            if (OUR_LIKELY(id < (uint64_t) fhd->_numSymbols))
            {
                symbol = fhd->_idToSymbol[id];
            }
            else
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Decoded an invalid symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

        }

        //
        // Shift over bit stream, and update the bit count in the buffer
        //

        buffer = buffer << codeLen;
        bufferNumBits -= codeLen;

        //
        // If we received a RLE symbol (_rleSymbol), then we need
        // to read ahead 8 bits to know how many times to repeat
        // the previous symbol. Need to ensure we at least have
        // 8 bits of data in the buffer
        //

        if (symbol == rleSym)
        {
            uint32_t rleCount;

            if (bufferNumBits < 8)
            {
                FastHufDecoder_refill (
                    &buffer,
                    bufferNumBits,
                    &bufferBack,
                    &bufferBackNumBits,
                    &currByte,
                    &numSrcBits);

                bufferNumBits = 64;
            }

            rleCount = buffer >> 56;

            if (OUR_UNLIKELY(dstIdx < 1))
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (RLE code with no previous symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            if (OUR_UNLIKELY(dstIdx + (uint64_t) rleCount > numDstElems))
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Symbol run beyond expected output buffer length)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            if (OUR_UNLIKELY(rleCount == 0 || rleCount >= (uint32_t)INT32_MAX))
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Invalid RLE length)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            for (uint32_t i = 0; i < rleCount; ++i)
                dst[dstIdx + (uint64_t) i] = dst[dstIdx - 1];

            dstIdx += rleCount;

            buffer = buffer << 8;
            bufferNumBits -= 8;
        }
        else
        {
            dst[dstIdx] = (uint16_t) symbol;
            dstIdx++;
        }

        //
        // refill bit stream buffer if we're below the number of
        // bits needed for a table lookup
        //

        if (bufferNumBits < TABLE_LOOKUP_BITS)
        {
            FastHufDecoder_refill (
                &buffer,
                bufferNumBits,
                &bufferBack,
                &bufferBackNumBits,
                &currByte,
                &numSrcBits);

            bufferNumBits = 64;
        }
    }

    if (OUR_UNLIKELY(numSrcBits != 0))
    {
        if (pctxt)
            pctxt->print_error (
                pctxt,
                EXR_ERR_CORRUPT_CHUNK,
                "Huffman decode error (%d bits of compressed data remains after filling expected output buffer)",
                (int) numSrcBits);
        return EXR_ERR_CORRUPT_CHUNK;
    }

    return EXR_ERR_SUCCESS;
}